

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

float notch::core::internal::conv2dAt<3ul,float_const*>
                (float *imagePos,size_t imageWidth,float *kernel)

{
  return imagePos[imageWidth + 1] * *kernel +
         imagePos[imageWidth] * kernel[1] +
         imagePos[imageWidth - 1] * kernel[2] +
         imagePos[1] * kernel[3] +
         *imagePos * kernel[4] +
         imagePos[-1] * kernel[5] +
         imagePos[1 - imageWidth] * kernel[6] +
         imagePos[-1 - imageWidth] * kernel[8] + imagePos[-imageWidth] * kernel[7];
}

Assistant:

inline float
conv2dAt(Iter imagePos, const size_t imageWidth, Iter kernel) {
    Iter row1 = imagePos - imageWidth - 1;
    Iter row2 = imagePos - 1;
    Iter row3 = imagePos + imageWidth - 1;
    Iter krow1 = kernel;
    Iter krow2 = kernel + kernelSize;
    Iter krow3 = kernel + 2 * kernelSize;
    return (*(row1    )) * (*(krow3 + 2)) +
           (*(row1 + 1)) * (*(krow3 + 1)) +
           (*(row1 + 2)) * (*(krow3    )) +
           (*(row2    )) * (*(krow2 + 2)) +
           (*(row2 + 1)) * (*(krow2 + 1)) +
           (*(row2 + 2)) * (*(krow2 + 0)) +
           (*(row3    )) * (*(krow1 + 2)) +
           (*(row3 + 1)) * (*(krow1 + 1)) +
           (*(row3 + 2)) * (*(krow1    ));
}